

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O0

void __thiscall scApp::commandOptions::basisOptions::basisOptions(basisOptions *this)

{
  int iVar1;
  undefined4 *in_RDI;
  int i;
  uint32_t tc;
  undefined4 in_stack_fffffffffffffff0;
  
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x14),in_RDI + 2,1,10000);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x18),in_RDI + 4,1,0xff);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x1c),in_RDI + 5,1,0x3f00);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x20),in_RDI + 7,1,0x3f00);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x24),in_RDI + 0xf,0x100,0x10000);
  clampedOption<float>::clampedOption
            ((clampedOption<float> *)(in_RDI + 0x28),(float *)(in_RDI + 0xe),0.001,50.0);
  clampedOption<float>::clampedOption
            ((clampedOption<float> *)(in_RDI + 0x2c),(float *)(in_RDI + 0x10),1.0,300.0);
  clampedOption<float>::clampedOption
            ((clampedOption<float> *)(in_RDI + 0x30),(float *)(in_RDI + 0x11),0.01,65536.0);
  iVar1 = std::thread::hardware_concurrency();
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  in_RDI[0x17] = iVar1;
  clampedOption<unsigned_int>::operator=
            ((clampedOption<unsigned_int> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
             (uint)((ulong)in_RDI >> 0x20));
  *in_RDI = 0x4c;
  in_RDI[3] = _KTX_ETC1S_DEFAULT_COMPRESSION_LEVEL + -1;
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0x18));
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0x1c));
  in_RDI[6] = 0;
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0x20));
  in_RDI[8] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)(in_RDI + 0xd) = 0;
  in_RDI[0xc] = 2;
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0x24));
  clampedOption<float>::clear((clampedOption<float> *)(in_RDI + 0x28));
  *(undefined1 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    *(undefined1 *)((long)in_RDI + (long)iVar1 + 0x24) = 0;
  }
  return;
}

Assistant:

basisOptions() :
                threadCount(ktxBasisParams::threadCount, 1, 10000),
                qualityLevel(ktxBasisParams::qualityLevel, 1, 255),
                maxEndpoints(ktxBasisParams::maxEndpoints, 1, 16128),
                maxSelectors(ktxBasisParams::maxSelectors, 1, 16128),
                uastcRDODictSize(ktxBasisParams::uastcRDODictSize, 256, 65536),
                uastcRDOQualityScalar(ktxBasisParams::uastcRDOQualityScalar,
                                      0.001f, 50.0f),
                uastcRDOMaxSmoothBlockErrorScale(
                              ktxBasisParams::uastcRDOMaxSmoothBlockErrorScale,
                              1.0f, 300.0f),
                uastcRDOMaxSmoothBlockStdDev(
                              ktxBasisParams::uastcRDOMaxSmoothBlockStdDev,
                              0.01f, 65536.0f)
            {
                uint32_t tc = thread::hardware_concurrency();
                if (tc == 0) tc = 1;
                threadCount.max = tc;
                threadCount = tc;

                structSize = sizeof(ktxBasisParams);
                // - 1 is to match what basisu_tool does (since 1.13).
                compressionLevel = KTX_ETC1S_DEFAULT_COMPRESSION_LEVEL - 1;
                qualityLevel.clear();
                maxEndpoints.clear();
                endpointRDOThreshold = 0.0f;
                maxSelectors.clear();
                selectorRDOThreshold = 0.0f;
                normalMap = false;
                separateRGToRGB_A = false;
                preSwizzle = false;
                noEndpointRDO = false;
                noSelectorRDO = false;
                uastc = false; // Default to ETC1S.
                uastcRDO = false;
                uastcFlags = KTX_PACK_UASTC_LEVEL_DEFAULT;
                uastcRDODictSize.clear();
                uastcRDOQualityScalar.clear();
                uastcRDODontFavorSimplerModes = false;
                uastcRDONoMultithreading = false;
                noSSE = false;
                verbose = false; // Default to quiet operation.
                for (int i = 0; i < 4; i++) inputSwizzle[i] = 0;
            }